

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::UnshiftHelper<double>
               (JavascriptArray *pArr,uint32 unshiftElements,Var *elements)

{
  uint uVar1;
  SparseArraySegmentBase *this;
  bool hasNoMissingValues;
  
  this = (pArr->head).ptr;
  Memory::MoveArray<double,double,Memory::Recycler>
            ((double *)(&this[1].left + (ulong)unshiftElements * 2),(double *)(this + 1),
             (ulong)this->length);
  uVar1 = this->length;
  this->length = unshiftElements + uVar1;
  SparseArraySegmentBase::CheckLengthvsSize(this);
  InvalidateLastUsedSegment(pArr);
  hasNoMissingValues = HasNoMissingValues(pArr);
  if (uVar1 < unshiftElements) {
    SetHasNoMissingValues(pArr,false);
  }
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x76])
            (pArr,(ulong)unshiftElements,0,elements,0,1);
  SetHasNoMissingValues(pArr,hasNoMissingValues);
  return;
}

Assistant:

void JavascriptArray::UnshiftHelper(JavascriptArray* pArr, uint32 unshiftElements, Js::Var * elements)
    {
        SparseArraySegment<T>* head = SparseArraySegment<T>::From(pArr->head);
        // Make enough room in the head segment to insert new elements at the front
        MoveArray(head->elements + unshiftElements, head->elements, pArr->head->length);
        uint32 oldHeadLength = head->length;
        head->length += unshiftElements;
        head->CheckLengthvsSize();

        /* Set head segment as the last used segment */
        pArr->InvalidateLastUsedSegment();

        bool hasNoMissingValues = pArr->HasNoMissingValues();

        /* Set HasNoMissingValues to false -> Since we shifted elements right, we might have missing values after the memmove */
        if(unshiftElements > oldHeadLength)
        {
            pArr->SetHasNoMissingValues(false);
        }

#if ENABLE_PROFILE_INFO
        pArr->FillFromArgs(unshiftElements, 0, elements, nullptr, true/*dontCreateNewArray*/);
#else
        pArr->FillFromArgs(unshiftElements, 0, elements, true/*dontCreateNewArray*/);
#endif

        // Setting back to the old value
        pArr->SetHasNoMissingValues(hasNoMissingValues);
    }